

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O1

void __thiscall QCalendarWidgetPrivate::_q_nextMonthClicked(QCalendarWidgetPrivate *this)

{
  QDate date;
  long in_FS_OFFSET;
  undefined8 local_38;
  undefined1 *puStack_30;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_28.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  local_38 = (qint64)&DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  QAbstractItemView::currentIndex((QModelIndex *)&local_38,(QAbstractItemView *)this->m_view);
  local_38 = QtPrivate::QCalendarModel::dateForCell(this->m_model,(int)local_38,local_38._4_4_);
  date.jd = QDate::addMonths(&local_38,1,*(undefined8 *)&this->m_model->m_calendar);
  updateCurrentPage(this,date);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QCalendarWidgetPrivate::_q_nextMonthClicked()
{
    QDate currentDate = getCurrentDate().addMonths(1, m_model->m_calendar);
    updateCurrentPage(currentDate);
}